

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O1

void __thiscall
IR::AutoReuseOpnd::Initialize(AutoReuseOpnd *this,Opnd *opnd,Func *func,bool autoDelete)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  
  if (this->opnd != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x728,"(!this->opnd)","!this->opnd");
    if (!bVar2) goto LAB_00426f85;
    *puVar4 = 0;
  }
  if (func == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x729,"(func)","func");
    if (!bVar2) goto LAB_00426f85;
    *puVar4 = 0;
  }
  if (opnd == (Opnd *)0x0) {
    this->wasInUse = true;
  }
  else {
    this->opnd = opnd;
    bVar3 = opnd->field_0xb & 2;
    this->wasInUse = (bool)(bVar3 >> 1);
    if (bVar3 == 0) {
      this->func = func;
      this->autoDelete = autoDelete;
      if (opnd->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar2) {
LAB_00426f85:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      if ((opnd->field_0xb & 2) == 0) {
        opnd->field_0xb = opnd->field_0xb | 2;
      }
      else {
        pOVar5 = Opnd::Copy(opnd,func);
        pOVar5->field_0xb = pOVar5->field_0xb | 2;
      }
    }
  }
  return;
}

Assistant:

void Initialize(Opnd *const opnd, Func *const func, const bool autoDelete = true)
    {
        Assert(!this->opnd);
        Assert(func);

        if(!opnd)
        {
            // Simulate the default constructor
            wasInUse = true;
            return;
        }

        this->opnd = opnd;
        wasInUse = opnd->IsInUse();
        if(wasInUse)
        {
            return;
        }
        this->func = func;
        this->autoDelete = autoDelete;

        // Create a fake use of the opnd to enable opnd reuse during lowering. One issue is that when an unused opnd is first
        // used in an instruction and the instruction is legalized, the opnd may be replaced by legalization and the original
        // opnd would be freed. By creating a fake use, it forces the opnd to be copied when used by the instruction, so the
        // original opnd can continue to be reused for other instructions. Typically, any opnds used during lowering in more
        // than one instruction can use this class to enable opnd reuse.
        opnd->Use(func);
    }